

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

bool __thiscall cmVSLink::Parse(cmVSLink *this,const_iterator argBeg,const_iterator argEnd)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string intDir;
  
  intDir._M_dataplus._M_p = (pointer)&intDir.field_2;
  intDir._M_string_length = 0;
  intDir.field_2._M_local_buf[0] = '\0';
  while( true ) {
    if ((argBeg._M_current == argEnd._M_current) ||
       (bVar1 = cmHasLiteralPrefix<std::__cxx11::string,2ul>
                          (argBeg._M_current,(char (*) [2])0x452f9e), !bVar1)) goto LAB_001459f3;
    bVar1 = std::operator==(argBeg._M_current,"--");
    if (bVar1) break;
    bVar1 = std::operator==(argBeg._M_current,"--manifests");
    if (bVar1) {
      while ((argBeg._M_current = argBeg._M_current + 1, argBeg._M_current != argEnd._M_current &&
             (bVar1 = cmHasLiteralPrefix<std::__cxx11::string,2ul>
                                (argBeg._M_current,(char (*) [2])0x452f9e), !bVar1))) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->UserManifests,argBeg._M_current);
      }
    }
    else {
      bVar1 = cmHasLiteralPrefix<std::__cxx11::string,10ul>
                        (argBeg._M_current,(char (*) [10])"--intdir=");
      if (bVar1) {
        std::__cxx11::string::substr((ulong)&local_78,(ulong)argBeg._M_current);
        psVar4 = &intDir;
      }
      else {
        bVar1 = cmHasLiteralPrefix<std::__cxx11::string,6ul>
                          (argBeg._M_current,(char (*) [6])"--rc=");
        if (bVar1) {
          std::__cxx11::string::substr((ulong)&local_78,(ulong)argBeg._M_current);
          psVar4 = &this->RcPath;
        }
        else {
          bVar1 = cmHasLiteralPrefix<std::__cxx11::string,6ul>
                            (argBeg._M_current,(char (*) [6])"--mt=");
          if (!bVar1) {
            poVar3 = std::operator<<((ostream *)&std::cerr,"unknown argument \'");
            poVar3 = std::operator<<(poVar3,(string *)argBeg._M_current);
            std::operator<<(poVar3,"\'\n");
            goto LAB_00145c8d;
          }
          std::__cxx11::string::substr((ulong)&local_78,(ulong)argBeg._M_current);
          psVar4 = &this->MtPath;
        }
      }
      std::__cxx11::string::operator=((string *)psVar4,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      argBeg._M_current = argBeg._M_current + 1;
    }
  }
  argBeg._M_current = argBeg._M_current + 1;
LAB_001459f3:
  bVar1 = false;
  if ((intDir._M_string_length != 0) && (argBeg._M_current != argEnd._M_current)) {
    this_00 = &this->LinkCommand;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (this->LinkCommand).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )argBeg._M_current,
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )argEnd._M_current);
    for (; argBeg._M_current != argEnd._M_current; argBeg._M_current = argBeg._M_current + 1) {
      iVar2 = cmsys::SystemTools::Strucmp
                        (((argBeg._M_current)->_M_dataplus)._M_p,"/INCREMENTAL:YES");
      if ((iVar2 == 0) ||
         (iVar2 = cmsys::SystemTools::Strucmp
                            (((argBeg._M_current)->_M_dataplus)._M_p,"/INCREMENTAL"), iVar2 == 0)) {
        this->Incremental = true;
      }
      else {
        iVar2 = cmsys::SystemTools::Strucmp(((argBeg._M_current)->_M_dataplus)._M_p,"/MANIFEST:NO");
        if (iVar2 == 0) {
          this->LinkGeneratesManifest = false;
        }
        else {
          bVar1 = cmHasLiteralPrefix<std::__cxx11::string,4ul>
                            (argBeg._M_current,(char (*) [4])"/Fe");
          if (bVar1) {
            std::__cxx11::string::substr((ulong)&local_78,(ulong)argBeg._M_current);
          }
          else {
            bVar1 = cmHasLiteralPrefix<std::__cxx11::string,6ul>
                              (argBeg._M_current,(char (*) [6])"/out:");
            if (!bVar1) goto LAB_00145aeb;
            std::__cxx11::string::substr((ulong)&local_78,(ulong)argBeg._M_current);
          }
          std::__cxx11::string::operator=((string *)&this->TargetFile,(string *)&local_78);
          std::__cxx11::string::~string((string *)&local_78);
        }
      }
LAB_00145aeb:
    }
    if ((this->TargetFile)._M_string_length == 0) {
LAB_00145c8d:
      bVar1 = false;
    }
    else {
      std::operator+(&local_78,&intDir,"/embed.manifest");
      std::__cxx11::string::operator=((string *)&this->ManifestFile,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::operator+(&local_78,&intDir,"/intermediate.manifest");
      psVar4 = &this->LinkerManifestFile;
      std::__cxx11::string::operator=((string *)psVar4,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      if (this->Incremental == true) {
        std::operator+(&local_78,&intDir,"/manifest.rc");
        std::__cxx11::string::operator=((string *)&this->ManifestFileRC,(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::operator+(&local_78,&intDir,"/manifest.res");
        std::__cxx11::string::operator=((string *)&this->ManifestFileRes,(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
      else if ((this->UserManifests).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               (this->UserManifests).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
        std::operator+(&local_78,&this->TargetFile,".manifest");
        std::__cxx11::string::operator=((string *)&this->ManifestFile,(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::_M_assign((string *)psVar4);
      }
      bVar1 = true;
      if (this->LinkGeneratesManifest == true) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[10]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (char (*) [10])"/MANIFEST");
        std::operator+(&local_78,"/MANIFESTFILE:",psVar4);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   &local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
    }
  }
  std::__cxx11::string::~string((string *)&intDir);
  return bVar1;
}

Assistant:

bool cmVSLink::Parse(std::vector<std::string>::const_iterator argBeg,
                     std::vector<std::string>::const_iterator argEnd)
{
  // Parse our own arguments.
  std::string intDir;
  std::vector<std::string>::const_iterator arg = argBeg;
  while (arg != argEnd && cmHasLiteralPrefix(*arg, "-")) {
    if (*arg == "--") {
      ++arg;
      break;
    }
    if (*arg == "--manifests") {
      for (++arg; arg != argEnd && !cmHasLiteralPrefix(*arg, "-"); ++arg) {
        this->UserManifests.push_back(*arg);
      }
    } else if (cmHasLiteralPrefix(*arg, "--intdir=")) {
      intDir = arg->substr(9);
      ++arg;
    } else if (cmHasLiteralPrefix(*arg, "--rc=")) {
      this->RcPath = arg->substr(5);
      ++arg;
    } else if (cmHasLiteralPrefix(*arg, "--mt=")) {
      this->MtPath = arg->substr(5);
      ++arg;
    } else {
      std::cerr << "unknown argument '" << *arg << "'\n";
      return false;
    }
  }
  if (intDir.empty()) {
    return false;
  }

  // The rest of the arguments form the link command.
  if (arg == argEnd) {
    return false;
  }
  this->LinkCommand.insert(this->LinkCommand.begin(), arg, argEnd);

  // Parse the link command to extract information we need.
  for (; arg != argEnd; ++arg) {
    if (cmSystemTools::Strucmp(arg->c_str(), "/INCREMENTAL:YES") == 0) {
      this->Incremental = true;
    } else if (cmSystemTools::Strucmp(arg->c_str(), "/INCREMENTAL") == 0) {
      this->Incremental = true;
    } else if (cmSystemTools::Strucmp(arg->c_str(), "/MANIFEST:NO") == 0) {
      this->LinkGeneratesManifest = false;
    } else if (cmHasLiteralPrefix(*arg, "/Fe")) {
      this->TargetFile = arg->substr(3);
    } else if (cmHasLiteralPrefix(*arg, "/out:")) {
      this->TargetFile = arg->substr(5);
    }
  }

  if (this->TargetFile.empty()) {
    return false;
  }

  this->ManifestFile = intDir + "/embed.manifest";
  this->LinkerManifestFile = intDir + "/intermediate.manifest";

  if (this->Incremental) {
    // We will compile a resource containing the manifest and
    // pass it to the link command.
    this->ManifestFileRC = intDir + "/manifest.rc";
    this->ManifestFileRes = intDir + "/manifest.res";
  } else if (this->UserManifests.empty()) {
    // Prior to support for user-specified manifests CMake placed the
    // linker-generated manifest next to the binary (as if it were not to be
    // embedded) when not linking incrementally.  Preserve this behavior.
    this->ManifestFile = this->TargetFile + ".manifest";
    this->LinkerManifestFile = this->ManifestFile;
  }

  if (this->LinkGeneratesManifest) {
    this->LinkCommand.emplace_back("/MANIFEST");
    this->LinkCommand.push_back("/MANIFESTFILE:" + this->LinkerManifestFile);
  }

  return true;
}